

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crawler.cpp
# Opt level: O3

void __thiscall Crawler::genNewId(Crawler *this)

{
  bdNodeId *id;
  FILE *__stream;
  string stringID;
  string local_40;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->crwlrMutex);
  id = (bdNodeId *)operator_new(0x14);
  id->data[0] = '\0';
  id->data[1] = '\0';
  id->data[2] = '\0';
  id->data[3] = '\0';
  id->data[4] = '\0';
  id->data[5] = '\0';
  id->data[6] = '\0';
  id->data[7] = '\0';
  id->data[8] = '\0';
  id->data[9] = '\0';
  id->data[10] = '\0';
  id->data[0xb] = '\0';
  id->data[0xc] = '\0';
  id->data[0xd] = '\0';
  id->data[0xe] = '\0';
  id->data[0xf] = '\0';
  id->data[0x10] = '\0';
  id->data[0x11] = '\0';
  id->data[0x12] = '\0';
  id->data[0x13] = '\0';
  this->peerId = id;
  bdStdRandomNodeId(id);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Starting with ownID: ",0x15);
  bdStdPrintNodeId((ostream *)&std::cerr,this->peerId);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  __stream = fopen("my_ids","a+");
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bdStdPrintNodeId(&local_40,this->peerId,false);
  fprintf(__stream,"%s\n",local_40._M_dataplus._M_p);
  fclose(__stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->crwlrMutex);
  return;
}

Assistant:

void Crawler::genNewId() {
    bdStackMutex stack(crwlrMutex); /********** MUTEX LOCKED *************/
    peerId = new bdNodeId();
    bdStdRandomNodeId(peerId);
    std::cerr << "Starting with ownID: ";
    bdStdPrintNodeId(std::cerr, peerId);
    std::cerr << std::endl;
    FILE *myIDs = fopen(USED_IDS_FILENAME, "a+");
    std::string stringID;
    bdStdPrintNodeId(stringID, peerId, false);
    fprintf(myIDs, "%s\n", stringID.c_str());
    fclose(myIDs);
}